

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O2

char * promptsep(char *buf,int num_post_attribs)

{
  char cVar1;
  size_t sVar2;
  
  cVar1 = post_attribs;
  if ((1 < num_post_attribs) && ('\x01' < post_attribs && post_attribs < num_post_attribs)) {
    sVar2 = strlen(buf);
    (buf + sVar2)[0] = ',';
    (buf + sVar2)[1] = '\0';
  }
  sVar2 = strlen(buf);
  (buf + sVar2)[0] = ' ';
  (buf + sVar2)[1] = '\0';
  post_attribs = cVar1 + -1;
  if (post_attribs == '\0' && 1 < num_post_attribs) {
    sVar2 = strlen(buf);
    builtin_strncpy(buf + sVar2,"and ",5);
  }
  return buf;
}

Assistant:

static char *promptsep(char *buf, int num_post_attribs)
{
	const char *conj = "and ";
	if (num_post_attribs > 1
	    && post_attribs < num_post_attribs && post_attribs > 1)
		strcat(buf, ",");
	strcat(buf, " ");
	--post_attribs;
	if (!post_attribs && num_post_attribs > 1) strcat(buf, conj);
	return buf;
}